

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall
duckdb::MutableLogger::MutableLogger
          (MutableLogger *this,LogConfig *config_p,RegisteredLoggingContext context_p,
          LogManager *manager)

{
  LogManager *in_RDX;
  LogConfig *in_RSI;
  Logger *in_RDI;
  undefined1 *__src;
  LogMode __i;
  
  __src = &stack0x00000008;
  Logger::Logger(in_RDI,in_RDX);
  in_RDI->_vptr_Logger = (_func_int **)&PTR__MutableLogger_03508a28;
  ::std::mutex::mutex((mutex *)0x61e1ac);
  LogConfig::LogConfig(in_RSI,(LogConfig *)in_RDX);
  memcpy(&in_RDI[0xd].manager,__src,0x30);
  __i = (LogMode)((ulong)__src >> 0x38);
  ::std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)__i);
  ::std::atomic<duckdb::LogLevel>::operator=((atomic<duckdb::LogLevel> *)in_RDI,__i);
  ::std::atomic<duckdb::LogMode>::operator=((atomic<duckdb::LogMode> *)in_RDI,__i);
  return;
}

Assistant:

MutableLogger::MutableLogger(LogConfig &config_p, RegisteredLoggingContext context_p, LogManager &manager)
    : Logger(manager), config(config_p), context(context_p) {
	enabled = config.enabled;
	level = config.level;
	mode = config.mode;
}